

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

void __thiscall
MT32Emu::PartialManager::PartialManager(PartialManager *this,Synth *useSynth,Part **useParts)

{
  undefined1 auVar1 [16];
  Bit32u BVar2;
  ulong uVar3;
  Partial **ppPVar4;
  int *piVar5;
  Poly **ppPVar6;
  Partial *this_00;
  Poly *this_01;
  uint local_24;
  uint i;
  Part **useParts_local;
  Synth *useSynth_local;
  PartialManager *this_local;
  
  this->synth = useSynth;
  this->parts = useParts;
  BVar2 = Synth::getPartialCount(this->synth);
  this->inactivePartialCount = BVar2;
  auVar1 = ZEXT416(this->inactivePartialCount) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppPVar4 = (Partial **)operator_new__(uVar3);
  this->partialTable = ppPVar4;
  auVar1 = ZEXT416(this->inactivePartialCount) * ZEXT816(4);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar3);
  this->inactivePartials = piVar5;
  BVar2 = Synth::getPartialCount(this->synth);
  uVar3 = SUB168(ZEXT416(BVar2) * ZEXT816(8),0);
  if (SUB168(ZEXT416(BVar2) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppPVar6 = (Poly **)operator_new__(uVar3);
  this->freePolys = ppPVar6;
  this->firstFreePolyIndex = 0;
  local_24 = 0;
  while( true ) {
    BVar2 = Synth::getPartialCount(this->synth);
    if (BVar2 <= local_24) break;
    this_00 = (Partial *)operator_new(0x118);
    Partial::Partial(this_00,this->synth,local_24);
    this->partialTable[local_24] = this_00;
    this->inactivePartials[local_24] = ~local_24 + this->inactivePartialCount;
    this_01 = (Poly *)operator_new(0x48);
    Poly::Poly(this_01);
    this->freePolys[local_24] = this_01;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

PartialManager::PartialManager(Synth *useSynth, Part **useParts) {
	synth = useSynth;
	parts = useParts;
	inactivePartialCount = synth->getPartialCount();
	partialTable = new Partial *[inactivePartialCount];
	inactivePartials = new int[inactivePartialCount];
	freePolys = new Poly *[synth->getPartialCount()];
	firstFreePolyIndex = 0;
	for (unsigned int i = 0; i < synth->getPartialCount(); i++) {
		partialTable[i] = new Partial(synth, i);
		inactivePartials[i] = inactivePartialCount - i - 1;
		freePolys[i] = new Poly();
	}
}